

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O3

string * __thiscall
font2svg::glyph::pointlines_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  undefined1 *puVar1;
  string *psVar2;
  short sVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  string dash_mod;
  long *local_60;
  char *local_58;
  long local_50 [2];
  undefined1 *local_40;
  string *local_38;
  
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  puVar1 = &this->field_0x278;
  std::__cxx11::stringbuf::str((string *)puVar1);
  local_40 = puVar1;
  local_38 = __return_storage_ptr__;
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  puVar1 = &this->field_0x270;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"\n\n  <!-- draw straight lines between points -->",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"\n  <path fill=\'none\' stroke=\'green\' d=\'",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\n   M ",6);
  poVar4 = std::ostream::_M_insert<long>((long)puVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\n  \'/>",6);
  if (1 < (this->ftoutline).n_points) {
    uVar6 = 0;
    do {
      local_60 = local_50;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60);
      sVar3 = (this->ftoutline).n_contours;
      if (0 < sVar3) {
        lVar5 = 0;
        do {
          if (uVar6 == (uint)(int)this->contours[lVar5]) {
            std::__cxx11::string::_M_replace((ulong)&local_60,0,local_58,0x107739);
            sVar3 = (this->ftoutline).n_contours;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)puVar1,"\n  <path fill=\'none\' stroke=\'green\'",0x23);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)puVar1,(char *)local_60,(long)local_58);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," d=\'",4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," M ",3);
      poVar4 = std::ostream::_M_insert<long>((long)puVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
      std::ostream::_M_insert<long>((long)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," L ",3);
      uVar6 = uVar6 + 1;
      poVar4 = std::ostream::_M_insert<long>((long)puVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
      std::ostream::_M_insert<long>((long)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\n  \'/>",6);
      if (local_60 != local_50) {
        operator_delete(local_60,local_50[0] + 1);
      }
    } while ((long)uVar6 < (long)(this->ftoutline).n_points + -1);
  }
  psVar2 = local_38;
  std::__cxx11::stringbuf::str();
  return psVar2;
}

Assistant:

std::string pointlines()  {
		tmp.str("");
		tmp << "\n\n  <!-- draw straight lines between points -->";
		tmp << "\n  <path fill='none' stroke='green' d='";
		tmp << "\n   M " << ftpoints[0].x << "," << ftpoints[0].y << "\n";
		tmp << "\n  '/>";
		for ( int i = 0 ; i < ftoutline.n_points-1 ; i++ ) {
			std::string dash_mod("");
			for (int j = 0 ; j < ftoutline.n_contours; j++ ) {
				if (i==contours[j])
					dash_mod = " stroke-dasharray='3'";
			}
			tmp << "\n  <path fill='none' stroke='green'";
			tmp << dash_mod;
			tmp << " d='";
 			tmp << " M " << ftpoints[i].x << "," << ftpoints[i].y;
 			tmp << " L " << ftpoints[(i+1)%ftoutline.n_points].x << "," << ftpoints[(i+1)%ftoutline.n_points].y;
			tmp << "\n  '/>";
		}
		return tmp.str();
	}